

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

void __thiscall
double_conversion::Bignum::AssignDecimalString(Bignum *this,Vector<const_char> value)

{
  bool bVar1;
  ushort uVar2;
  long lVar3;
  ulong uVar4;
  int exponent;
  uint uVar5;
  int iVar6;
  uint64_t uVar7;
  char *pcVar8;
  
  exponent = value.length_;
  this->used_bigits_ = 0;
  this->exponent_ = 0;
  uVar5 = 0;
  if (0x12 < exponent) {
    uVar5 = 0;
    pcVar8 = value.start_;
    iVar6 = exponent;
    do {
      lVar3 = 0;
      uVar7 = 0;
      do {
        uVar7 = ((long)pcVar8[lVar3] + uVar7 * 10) - 0x30;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x13);
      uVar5 = uVar5 + 0x13;
      exponent = iVar6 + -0x13;
      MultiplyByPowerOfTen(this,0x13);
      AddUInt64(this,uVar7);
      pcVar8 = pcVar8 + 0x13;
      bVar1 = 0x25 < iVar6;
      iVar6 = exponent;
    } while (bVar1);
  }
  if (exponent < 1) {
    uVar7 = 0;
  }
  else {
    uVar4 = (ulong)uVar5;
    uVar7 = 0;
    do {
      uVar7 = ((long)value.start_[uVar4] + uVar7 * 10) - 0x30;
      uVar4 = uVar4 + 1;
    } while (uVar4 < exponent + uVar5);
  }
  MultiplyByPowerOfTen(this,exponent);
  AddUInt64(this,uVar7);
  uVar2 = this->used_bigits_;
  if ((short)uVar2 < 1) {
    if (uVar2 != 0) {
      return;
    }
  }
  else {
    do {
      if (this->bigits_buffer_[uVar2 - 1] != 0) {
        return;
      }
      this->used_bigits_ = uVar2 - 1;
      bVar1 = 1 < (short)uVar2;
      uVar2 = uVar2 - 1;
    } while (bVar1);
  }
  this->exponent_ = 0;
  return;
}

Assistant:

void Bignum::AssignDecimalString(const Vector<const char> value) {
  // 2^64 = 18446744073709551616 > 10^19
  static const int kMaxUint64DecimalDigits = 19;
  Zero();
  int length = value.length();
  unsigned pos = 0;
  // Let's just say that each digit needs 4 bits.
  while (length >= kMaxUint64DecimalDigits) {
    const uint64_t digits = ReadUInt64(value, pos, kMaxUint64DecimalDigits);
    pos += kMaxUint64DecimalDigits;
    length -= kMaxUint64DecimalDigits;
    MultiplyByPowerOfTen(kMaxUint64DecimalDigits);
    AddUInt64(digits);
  }
  const uint64_t digits = ReadUInt64(value, pos, length);
  MultiplyByPowerOfTen(length);
  AddUInt64(digits);
  Clamp();
}